

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O1

StringRef llvm::sys::detail::getHostCPUNameForS390x(StringRef ProcCpuinfoContent)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long_long *Result;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Separator;
  StringRef SVar11;
  unsigned_long_long ULLVal;
  SmallVector<llvm::StringRef,_32U> Lines;
  SmallVector<llvm::StringRef,_32U> CPUFeatures;
  StringRef local_470;
  StringRef local_460;
  SmallVectorImpl<llvm::StringRef> local_450;
  undefined1 local_440 [512];
  SmallVectorImpl<llvm::StringRef> local_240;
  undefined1 local_230 [512];
  
  local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_440;
  local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
  Result = (unsigned_long_long *)0xffffffff;
  Separator.Length = 1;
  Separator.Data = "\n";
  StringRef::split(&local_460,&local_450,Separator,-1,true);
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
  uVar6 = local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff;
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_230;
  if (uVar6 != 0) {
    lVar9 = 8;
    uVar7 = 0;
    do {
      if ((local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff) <= uVar7) goto LAB_001881d8;
      if ((7 < *(ulong *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar9)) &&
         (*(long *)((StringRef *)
                   ((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                          super_SmallVectorBase.BeginX + lVar9 + -8))->Data == 0x7365727574616566))
      {
        Str.Length = 1;
        Str.Data = ":";
        sVar5 = StringRef::find((StringRef *)
                                ((long)local_450.
                                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                       super_SmallVectorBase.BeginX + lVar9 + -8),Str,0);
        if (sVar5 != 0xffffffffffffffff) {
          if (local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
              (uint)uVar7) goto LAB_001881d8;
          if (*(ulong *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                               super_SmallVectorBase.BeginX + lVar9) <= sVar5) goto LAB_001881f7;
          local_470.Length =
               *(ulong *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar9) - (sVar5 + 1);
          local_470.Data =
               (char *)(sVar5 + 1 +
                       *(long *)((long)local_450.
                                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                       super_SmallVectorBase.BeginX + lVar9 + -8));
          Result = (unsigned_long_long *)0x1;
          StringRef::split(&local_470,&local_240,' ',-1,true);
          break;
        }
      }
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar6 != uVar7);
  }
  if ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
      0xffffffff) == 0) {
    bVar1 = true;
  }
  else {
    lVar9 = 0;
    bVar3 = 0;
    bVar2 = 0;
    do {
      if ((*(long *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                           super_SmallVectorBase.BeginX + lVar9 + 8) == 2) &&
         (bVar2 = bVar3,
         **(short **)
           ((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX + lVar9) == 0x7876)) {
        bVar3 = 1;
        bVar2 = 1;
      }
      lVar9 = lVar9 + 0x10;
    } while ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff) << 4 != lVar9);
    bVar1 = (bool)(bVar2 ^ 1);
  }
  if ((local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
      0xffffffff) != 0) {
    uVar8 = 0;
    lVar9 = 0;
    do {
      if ((9 < *(ulong *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar9 + 8)) &&
         ((short)(*(long **)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                   super_SmallVectorBase.BeginX + lVar9))[1] == 0x2072 &&
          **(long **)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX + lVar9) == 0x6f737365636f7270)) {
        Str_00.Length = 10;
        Str_00.Data = "machine = ";
        sVar5 = StringRef::find((StringRef *)
                                ((long)local_450.
                                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                       super_SmallVectorBase.BeginX + lVar9),Str_00,0);
        if (sVar5 != 0xffffffffffffffff) {
          if (local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
              uVar8) {
LAB_001881d8:
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                         );
          }
          uVar6 = sVar5 + 10;
          Str_01.Data = (char *)(*(ulong *)((long)local_450.
                                                  super_SmallVectorTemplateBase<llvm::StringRef,_true>
                                                  .
                                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>
                                                  .super_SmallVectorBase.BeginX + lVar9 + 8) - uVar6
                                );
          if (*(ulong *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                               super_SmallVectorBase.BeginX + lVar9 + 8) < uVar6) {
LAB_001881f7:
            __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                          ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
          }
          Str_01.Length = 10;
          bVar4 = getAsUnsignedInteger
                            ((llvm *)(uVar6 + *(long *)((long)local_450.
                                                                                                                            
                                                  super_SmallVectorTemplateBase<llvm::StringRef,_true>
                                                  .
                                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>
                                                  .super_SmallVectorBase.BeginX + lVar9)),Str_01,
                             (uint)&local_470,Result);
          if ((ulong)local_470.Data >> 0x20 == 0 && !bVar4) {
            uVar8 = (uint)local_470.Data;
            sVar5 = 3;
            if (!(bool)(uVar8 < 0xf42 | bVar1)) {
              pcVar10 = "z14";
              goto LAB_00188066;
            }
            if (0xb93 < uVar8 && !bVar1) {
              pcVar10 = "z13";
              goto LAB_00188066;
            }
            if (0xb0a < uVar8) {
              sVar5 = 5;
              pcVar10 = "zEC12";
              goto LAB_00188066;
            }
            if (0xb00 < uVar8) {
              sVar5 = 4;
              pcVar10 = "z196";
              goto LAB_00188066;
            }
          }
        }
        break;
      }
      lVar9 = lVar9 + 0x10;
      uVar8 = uVar8 + 1;
    } while ((local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff) << 4 != lVar9);
  }
  sVar5 = 7;
  pcVar10 = "generic";
LAB_00188066:
  if ((undefined1 *)
      local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
      local_230) {
    free(local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
  }
  if ((undefined1 *)
      local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
      local_440) {
    free(local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
  }
  SVar11.Length = sVar5;
  SVar11.Data = pcVar10;
  return SVar11;
}

Assistant:

StringRef sys::detail::getHostCPUNameForS390x(StringRef ProcCpuinfoContent) {
  // STIDP is a privileged operation, so use /proc/cpuinfo instead.

  // The "processor 0:" line comes after a fair amount of other information,
  // including a cache breakdown, but this should be plenty.
  SmallVector<StringRef, 32> Lines;
  ProcCpuinfoContent.split(Lines, "\n");

  // Look for the CPU features.
  SmallVector<StringRef, 32> CPUFeatures;
  for (unsigned I = 0, E = Lines.size(); I != E; ++I)
    if (Lines[I].startswith("features")) {
      size_t Pos = Lines[I].find(":");
      if (Pos != StringRef::npos) {
        Lines[I].drop_front(Pos + 1).split(CPUFeatures, ' ');
        break;
      }
    }

  // We need to check for the presence of vector support independently of
  // the machine type, since we may only use the vector register set when
  // supported by the kernel (and hypervisor).
  bool HaveVectorSupport = false;
  for (unsigned I = 0, E = CPUFeatures.size(); I != E; ++I) {
    if (CPUFeatures[I] == "vx")
      HaveVectorSupport = true;
  }

  // Now check the processor machine type.
  for (unsigned I = 0, E = Lines.size(); I != E; ++I) {
    if (Lines[I].startswith("processor ")) {
      size_t Pos = Lines[I].find("machine = ");
      if (Pos != StringRef::npos) {
        Pos += sizeof("machine = ") - 1;
        unsigned int Id;
        if (!Lines[I].drop_front(Pos).getAsInteger(10, Id)) {
          if (Id >= 3906 && HaveVectorSupport)
            return "z14";
          if (Id >= 2964 && HaveVectorSupport)
            return "z13";
          if (Id >= 2827)
            return "zEC12";
          if (Id >= 2817)
            return "z196";
        }
      }
      break;
    }
  }

  return "generic";
}